

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_dc_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  short sVar21;
  int iVar22;
  int iVar23;
  undefined8 *puVar24;
  ulong *puVar25;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  ushort uVar26;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar40;
  ushort uVar43;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ushort uVar46;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ushort uVar38;
  ushort uVar39;
  ushort uVar41;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar47;
  ushort uVar48;
  undefined1 auVar33 [16];
  __m128i src_temp12;
  __m128i src_temp11;
  WORD32 temp3;
  WORD32 temp2;
  WORD32 temp1;
  __m128i sm1;
  __m128i zero_8x16b;
  WORD32 itr_count;
  __m128i temp;
  __m128i sm;
  __m128i m_zero;
  __m128i src_temp2;
  __m128i src_temp10;
  __m128i src_temp9;
  __m128i src_temp8;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp3;
  __m128i src_temp7;
  __m128i src_temp1;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 log2nt;
  WORD32 row;
  WORD32 three_dc_val;
  WORD32 two_dc_val;
  WORD32 dc_val;
  WORD32 acc_dc;
  int local_15fc;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  ulong local_1588;
  ulong local_1578;
  undefined8 local_1568;
  undefined8 uStack_1560;
  ulong local_1558;
  ulong local_1548;
  ulong local_1538;
  char local_1514;
  int local_1510;
  byte local_1504;
  undefined8 *local_14f0;
  ushort local_b78;
  ushort uStack_b76;
  ushort uStack_b74;
  ushort uStack_b72;
  ushort uStack_b70;
  ushort uStack_b6e;
  ushort uStack_b6c;
  ushort uStack_b6a;
  ushort uStack_b52;
  ushort uStack_b50;
  ushort uStack_b4e;
  ushort uStack_b4c;
  ushort uStack_b4a;
  ushort uStack_b32;
  ushort uStack_b30;
  ushort uStack_b2e;
  ushort uStack_b2c;
  ushort uStack_b2a;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  short local_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  short sStack_ad0;
  short sStack_ace;
  short sStack_acc;
  short sStack_aca;
  short local_ac8;
  short sStack_ac6;
  short sStack_ac4;
  short sStack_ac2;
  short sStack_ac0;
  short sStack_abe;
  short sStack_abc;
  short sStack_aba;
  short local_ab8;
  short sStack_ab6;
  short sStack_ab4;
  short sStack_ab2;
  short sStack_ab0;
  short sStack_aae;
  short sStack_aac;
  short sStack_aaa;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short local_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  short sStack_a60;
  short sStack_a5e;
  short sStack_a5c;
  short sStack_a5a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  short local_a38;
  short sStack_a36;
  short sStack_a34;
  short sStack_a32;
  short sStack_a30;
  short sStack_a2e;
  short sStack_a2c;
  short sStack_a2a;
  short local_a18;
  short sStack_a16;
  short sStack_a14;
  short sStack_a12;
  short sStack_a10;
  short sStack_a0e;
  short sStack_a0c;
  short sStack_a0a;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  short local_9b8;
  short sStack_9b6;
  short sStack_9b4;
  short sStack_9b2;
  short sStack_9b0;
  short sStack_9ae;
  short sStack_9ac;
  short sStack_9aa;
  int local_5d8;
  int local_5b8;
  int local_598;
  uint local_578;
  uint local_558;
  uint local_538;
  int local_4f8;
  int local_4d8;
  ushort local_478;
  ushort uStack_476;
  ushort uStack_474;
  ushort local_458;
  ushort uStack_456;
  ushort uStack_454;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [256];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  __m128i src_temp17;
  __m128i src_temp16;
  __m128i src_temp15;
  __m128i src_temp14;
  __m128i src_temp13;
  
  local_1514 = '\x05';
  switch(in_R8D) {
  case 4:
    local_1514 = '\x02';
    break;
  default:
    break;
  case 8:
    local_1514 = '\x03';
    break;
  case 0x10:
    local_1514 = '\x04';
    break;
  case 0x20:
    local_1514 = '\x05';
  }
  iVar22 = in_R8D * 2;
  iVar23 = in_R8D * 3;
  if (in_R8D == 0x20) {
    auVar27 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x20),ZEXT816(0));
    auVar28 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x30),ZEXT816(0));
    auVar29 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x40),ZEXT816(0));
    auVar30 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x50),ZEXT816(0));
    local_9b8 = auVar27._0_2_;
    sStack_9b6 = auVar27._2_2_;
    sStack_9b4 = auVar27._4_2_;
    sStack_9b2 = auVar27._6_2_;
    sStack_9b0 = auVar27._8_2_;
    sStack_9ae = auVar27._10_2_;
    sStack_9ac = auVar27._12_2_;
    sStack_9aa = auVar27._14_2_;
    local_9c8 = auVar28._0_2_;
    sStack_9c6 = auVar28._2_2_;
    sStack_9c4 = auVar28._4_2_;
    sStack_9c2 = auVar28._6_2_;
    sStack_9c0 = auVar28._8_2_;
    sStack_9be = auVar28._10_2_;
    sStack_9bc = auVar28._12_2_;
    sStack_9ba = auVar28._14_2_;
    local_9d8 = auVar29._0_2_;
    sStack_9d6 = auVar29._2_2_;
    sStack_9d4 = auVar29._4_2_;
    sStack_9d2 = auVar29._6_2_;
    sStack_9d0 = auVar29._8_2_;
    sStack_9ce = auVar29._10_2_;
    sStack_9cc = auVar29._12_2_;
    sStack_9ca = auVar29._14_2_;
    local_9e8 = auVar30._0_2_;
    sStack_9e6 = auVar30._2_2_;
    sStack_9e4 = auVar30._4_2_;
    sStack_9e2 = auVar30._6_2_;
    sStack_9e0 = auVar30._8_2_;
    sStack_9de = auVar30._10_2_;
    sStack_9dc = auVar30._12_2_;
    sStack_9da = auVar30._14_2_;
    local_1568._0_4_ =
         CONCAT22(sStack_9b6 + sStack_9c6 + sStack_9d6 + sStack_9e6,
                  local_9b8 + local_9c8 + local_9d8 + local_9e8);
    local_1568._0_6_ =
         CONCAT24(sStack_9b4 + sStack_9c4 + sStack_9d4 + sStack_9e4,(undefined4)local_1568);
    local_1568 = CONCAT26(sStack_9b2 + sStack_9c2 + sStack_9d2 + sStack_9e2,(undefined6)local_1568);
    uStack_1560._0_2_ = sStack_9b0 + sStack_9c0 + sStack_9d0 + sStack_9e0;
    uStack_1560._2_2_ = sStack_9ae + sStack_9be + sStack_9ce + sStack_9de;
    uStack_1560._4_2_ = sStack_9ac + sStack_9bc + sStack_9cc + sStack_9dc;
    uStack_1560._6_2_ = sStack_9aa + sStack_9ba + sStack_9ca + sStack_9da;
    auVar20._8_8_ = uStack_1560;
    auVar20._0_8_ = local_1568;
    auVar33[8] = '\x0f';
    auVar33[9] = '\x0f';
    auVar33[10] = '\x0f';
    auVar33[0xb] = '\x0f';
    auVar33[0xc] = '\x0f';
    auVar33[0xd] = '\x0f';
    auVar33[0xe] = '\x0f';
    auVar33[0xf] = '\x0f';
    auVar33[0] = '\0';
    auVar33[1] = '\x01';
    auVar33[2] = '\b';
    auVar33[3] = '\t';
    auVar33[4] = '\x0f';
    auVar33[5] = '\x0f';
    auVar33[6] = '\x0f';
    auVar33[7] = '\x0f';
    auVar27 = pshufb(auVar20,auVar33);
    auVar27 = phaddw(auVar27,ZEXT816(0));
    local_4d8 = auVar27._0_4_;
    local_1504 = (byte)((int)(((local_4d8 + (uint)*(byte *)(in_RDI + iVar23)) -
                              (uint)*(byte *)(in_RDI + iVar22)) + 0x20) >> local_1514 + 1);
    local_1d0._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1d8._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    uVar11 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_1d8._0_3_)))))
    ;
    uVar12 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_1d0._0_3_)))))
    ;
    local_14f0 = in_RDX;
    for (local_15fc = 0; local_15fc < 2; local_15fc = local_15fc + 1) {
      *local_14f0 = uVar11;
      local_14f0[1] = uVar12;
      *(undefined8 *)((long)local_14f0 + (long)in_ECX) = uVar11;
      ((undefined8 *)((long)local_14f0 + (long)in_ECX))[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 1));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 3));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 2));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 5));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 6));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 7));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 3));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 9));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 10));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xb));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xc));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xd));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xe));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xf));
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      local_14f0[2] = uVar11;
      local_14f0[3] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)in_ECX + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 1) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 3) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 2) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 5) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 6) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 7) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 3) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 9) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 10) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xb) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xc) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xd) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xe) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      puVar24 = (undefined8 *)((long)local_14f0 + (long)(in_ECX * 0xf) + 0x10);
      *puVar24 = uVar11;
      puVar24[1] = uVar12;
      local_14f0 = (undefined8 *)((long)local_14f0 + (long)(in_ECX << 4));
    }
  }
  else if (in_R8D == 4) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + 1 + (long)iVar22);
    auVar27 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 4),
                       *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 4));
    auVar28 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
    auVar27 = phaddw(auVar27,ZEXT816(0));
    auVar27 = phaddw(auVar27,ZEXT816(0));
    auVar27 = phaddw(auVar27,ZEXT816(0));
    local_4f8 = auVar27._0_4_;
    iVar23 = (int)(((local_4f8 + (uint)*(byte *)(in_RDI + iVar23)) -
                   (uint)*(byte *)(in_RDI + iVar22)) + 4) >> local_1514 + 1;
    sVar21 = (short)(iVar23 * 3) + 2;
    local_a18 = auVar28._0_2_;
    sStack_a16 = auVar28._2_2_;
    sStack_a14 = auVar28._4_2_;
    sStack_a12 = auVar28._6_2_;
    sStack_a10 = auVar28._8_2_;
    sStack_a0e = auVar28._10_2_;
    sStack_a0c = auVar28._12_2_;
    sStack_a0a = auVar28._14_2_;
    uVar26 = (ushort)(local_a18 + sVar21) >> 2;
    uVar34 = (ushort)(sStack_a16 + sVar21) >> 2;
    uVar35 = (ushort)(sStack_a14 + sVar21) >> 2;
    uVar36 = (ushort)(sStack_a12 + sVar21) >> 2;
    uVar37 = (ushort)(sStack_a10 + sVar21) >> 2;
    uVar40 = (ushort)(sStack_a0e + sVar21) >> 2;
    uVar43 = (ushort)(sStack_a0c + sVar21) >> 2;
    uVar46 = (ushort)(sStack_a0a + sVar21) >> 2;
    local_15c8._0_2_ =
         CONCAT11((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34),
                  (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26));
    local_15c8._0_3_ =
         CONCAT12((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                  (undefined2)local_15c8);
    local_15c8._0_4_ =
         CONCAT13((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined3)local_15c8);
    local_15c8._0_5_ =
         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  (undefined4)local_15c8);
    local_15c8._0_6_ =
         CONCAT15((uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40),
                  (undefined5)local_15c8);
    local_15c8._0_7_ =
         CONCAT16((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43),
                  (undefined6)local_15c8);
    local_15c8 = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46),
                          (undefined7)local_15c8);
    *(undefined4 *)in_RDX = (undefined4)local_15c8;
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar22 + -1)) + iVar23 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar22 + 1)) + 2) >> 2);
    for (local_1510 = 1; local_1510 < 4; local_1510 = local_1510 + 1) {
      *(char *)((long)in_RDX + (long)(local_1510 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar22 + -1) - local_1510)) + iVar23 * 3 + 2) >>
                 2);
    }
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_15c8 & 0xffffffffffffff00 | (ulong)(byte)iVar23;
    auVar27 = pshufb(auVar32,ZEXT816((ulong)0));
    auVar28 = pshufb(auVar27,ZEXT816((ulong)0));
    auVar29 = pshufb(auVar27,ZEXT816((ulong)0));
    local_538 = auVar27._0_4_ & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)in_ECX);
    local_558 = auVar28._0_4_ & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)(in_ECX * 2));
    local_578 = auVar29._0_4_ & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)(in_ECX * 3));
    *(uint *)((long)in_RDX + (long)in_ECX) = local_538;
    *(uint *)((long)in_RDX + (long)(in_ECX << 1)) = local_558;
    *(uint *)((long)in_RDX + (long)(in_ECX * 3)) = local_578;
  }
  else if (in_R8D == 8) {
    auVar27 = psadbw(*(undefined1 (*) [16])(in_RDI + 8),ZEXT816(0));
    auVar31[8] = '\x0f';
    auVar31[9] = '\x0f';
    auVar31[10] = '\x0f';
    auVar31[0xb] = '\x0f';
    auVar31[0xc] = '\x0f';
    auVar31[0xd] = '\x0f';
    auVar31[0xe] = '\x0f';
    auVar31[0xf] = '\x0f';
    auVar31[0] = '\0';
    auVar31[1] = '\x01';
    auVar31[2] = '\b';
    auVar31[3] = '\t';
    auVar31[4] = '\x0f';
    auVar31[5] = '\x0f';
    auVar31[6] = '\x0f';
    auVar31[7] = '\x0f';
    auVar27 = pshufb(auVar27,auVar31);
    auVar27 = phaddw(auVar27,ZEXT816(0));
    local_598 = auVar27._0_4_;
    iVar23 = (int)(((local_598 + (uint)*(byte *)(in_RDI + iVar23)) -
                   (uint)*(byte *)(in_RDI + iVar22)) + 8) >> local_1514 + 1;
    sVar21 = (short)(iVar23 * 3) + 2;
    pauVar1 = (undefined1 (*) [16])(in_RDI + 1 + (long)iVar22);
    auVar27 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
    local_a38 = auVar27._0_2_;
    sStack_a36 = auVar27._2_2_;
    sStack_a34 = auVar27._4_2_;
    sStack_a32 = auVar27._6_2_;
    sStack_a30 = auVar27._8_2_;
    sStack_a2e = auVar27._10_2_;
    sStack_a2c = auVar27._12_2_;
    sStack_a2a = auVar27._14_2_;
    uVar26 = (ushort)(local_a38 + sVar21) >> 2;
    uVar34 = (ushort)(sStack_a36 + sVar21) >> 2;
    uVar35 = (ushort)(sStack_a34 + sVar21) >> 2;
    uVar36 = (ushort)(sStack_a32 + sVar21) >> 2;
    uVar37 = (ushort)(sStack_a30 + sVar21) >> 2;
    uVar40 = (ushort)(sStack_a2e + sVar21) >> 2;
    uVar43 = (ushort)(sStack_a2c + sVar21) >> 2;
    uVar46 = (ushort)(sStack_a2a + sVar21) >> 2;
    local_15c8._0_2_ =
         CONCAT11((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34),
                  (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26));
    local_15c8._0_3_ =
         CONCAT12((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                  (undefined2)local_15c8);
    local_15c8._0_4_ =
         CONCAT13((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined3)local_15c8);
    local_15c8._0_5_ =
         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  (undefined4)local_15c8);
    local_15c8._0_6_ =
         CONCAT15((uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40),
                  (undefined5)local_15c8);
    local_15c8._0_7_ =
         CONCAT16((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43),
                  (undefined6)local_15c8);
    local_15c8 = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46),
                          (undefined7)local_15c8);
    *in_RDX = local_15c8;
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar22 + -1)) + iVar23 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar22 + 1)) + 2) >> 2);
    for (local_1510 = 1; local_1510 < 8; local_1510 = local_1510 + 1) {
      *(char *)((long)in_RDX + (long)(local_1510 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar22 + -1) - local_1510)) + iVar23 * 3 + 2) >>
                 2);
    }
    local_1504 = (byte)iVar23;
    bVar5 = *(byte *)((long)in_RDX + (long)(in_ECX * 2));
    bVar6 = *(byte *)((long)in_RDX + (long)(in_ECX * 3));
    bVar7 = *(byte *)((long)in_RDX + (long)(in_ECX << 2));
    bVar8 = *(byte *)((long)in_RDX + (long)(in_ECX * 5));
    bVar9 = *(byte *)((long)in_RDX + (long)(in_ECX * 6));
    bVar10 = *(byte *)((long)in_RDX + (long)(in_ECX * 7));
    *(ulong *)((long)in_RDX + (long)in_ECX) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)*(byte *)((long)in_RDX + (long)in_ECX);
    *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar5;
    *(ulong *)((long)in_RDX + (long)(in_ECX * 3)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar6;
    *(ulong *)((long)in_RDX + (long)(in_ECX << 2)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar7;
    *(ulong *)((long)in_RDX + (long)(in_ECX * 5)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar8;
    *(ulong *)((long)in_RDX + (long)(in_ECX * 6)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar9;
    *(ulong *)((long)in_RDX + (long)(in_ECX * 7)) =
         (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
         (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
         (ulong)local_1504 << 0x38 | (ulong)bVar10;
  }
  else if (in_R8D == 0x10) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + 1 + (long)iVar22);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 9 + (long)iVar22);
    auVar27 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x10),ZEXT816(0));
    auVar28 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x20),ZEXT816(0));
    auVar31 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
    auVar32 = pmovzxbw(*pauVar2,*(undefined8 *)*pauVar2);
    local_a58 = auVar27._0_2_;
    sStack_a56 = auVar27._2_2_;
    sStack_a54 = auVar27._4_2_;
    sStack_a52 = auVar27._6_2_;
    sStack_a50 = auVar27._8_2_;
    sStack_a4e = auVar27._10_2_;
    sStack_a4c = auVar27._12_2_;
    sStack_a4a = auVar27._14_2_;
    local_a68 = auVar28._0_2_;
    sStack_a66 = auVar28._2_2_;
    sStack_a64 = auVar28._4_2_;
    sStack_a62 = auVar28._6_2_;
    sStack_a60 = auVar28._8_2_;
    sStack_a5e = auVar28._10_2_;
    sStack_a5c = auVar28._12_2_;
    sStack_a5a = auVar28._14_2_;
    local_1568._0_4_ = CONCAT22(sStack_a56 + sStack_a66,local_a58 + local_a68);
    local_1568._0_6_ = CONCAT24(sStack_a54 + sStack_a64,(undefined4)local_1568);
    local_1568 = CONCAT26(sStack_a52 + sStack_a62,(undefined6)local_1568);
    uStack_1560._0_2_ = sStack_a50 + sStack_a60;
    uStack_1560._2_2_ = sStack_a4e + sStack_a5e;
    uStack_1560._4_2_ = sStack_a4c + sStack_a5c;
    uStack_1560._6_2_ = sStack_a4a + sStack_a5a;
    auVar30._8_8_ = uStack_1560;
    auVar30._0_8_ = local_1568;
    auVar29[8] = '\x0f';
    auVar29[9] = '\x0f';
    auVar29[10] = '\x0f';
    auVar29[0xb] = '\x0f';
    auVar29[0xc] = '\x0f';
    auVar29[0xd] = '\x0f';
    auVar29[0xe] = '\x0f';
    auVar29[0xf] = '\x0f';
    auVar29[0] = '\0';
    auVar29[1] = '\x01';
    auVar29[2] = '\b';
    auVar29[3] = '\t';
    auVar29[4] = '\x0f';
    auVar29[5] = '\x0f';
    auVar29[6] = '\x0f';
    auVar29[7] = '\x0f';
    auVar27 = pshufb(auVar30,auVar29);
    auVar27 = phaddw(auVar27,ZEXT816(0));
    local_5b8 = auVar27._0_4_;
    iVar23 = (int)(((local_5b8 + (uint)*(byte *)(in_RDI + iVar23)) -
                   (uint)*(byte *)(in_RDI + iVar22)) + 0x10) >> local_1514 + 1;
    sVar21 = (short)(iVar23 * 3) + 2;
    local_a78 = auVar31._0_2_;
    sStack_a76 = auVar31._2_2_;
    sStack_a74 = auVar31._4_2_;
    sStack_a72 = auVar31._6_2_;
    sStack_a70 = auVar31._8_2_;
    sStack_a6e = auVar31._10_2_;
    sStack_a6c = auVar31._12_2_;
    sStack_a6a = auVar31._14_2_;
    local_a98 = auVar32._0_2_;
    sStack_a96 = auVar32._2_2_;
    sStack_a94 = auVar32._4_2_;
    sStack_a92 = auVar32._6_2_;
    sStack_a90 = auVar32._8_2_;
    sStack_a8e = auVar32._10_2_;
    sStack_a8c = auVar32._12_2_;
    sStack_a8a = auVar32._14_2_;
    uVar26 = (ushort)(local_a78 + sVar21) >> 2;
    uVar35 = (ushort)(sStack_a76 + sVar21) >> 2;
    uVar37 = (ushort)(sStack_a74 + sVar21) >> 2;
    uVar43 = (ushort)(sStack_a72 + sVar21) >> 2;
    uVar38 = (ushort)(sStack_a70 + sVar21) >> 2;
    uVar41 = (ushort)(sStack_a6e + sVar21) >> 2;
    uVar44 = (ushort)(sStack_a6c + sVar21) >> 2;
    uVar47 = (ushort)(sStack_a6a + sVar21) >> 2;
    uVar34 = (ushort)(local_a98 + sVar21) >> 2;
    uVar36 = (ushort)(sStack_a96 + sVar21) >> 2;
    uVar40 = (ushort)(sStack_a94 + sVar21) >> 2;
    uVar46 = (ushort)(sStack_a92 + sVar21) >> 2;
    uVar39 = (ushort)(sStack_a90 + sVar21) >> 2;
    uVar42 = (ushort)(sStack_a8e + sVar21) >> 2;
    uVar45 = (ushort)(sStack_a8c + sVar21) >> 2;
    uVar48 = (ushort)(sStack_a8a + sVar21) >> 2;
    local_15c8._0_2_ =
         CONCAT11((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                  (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26));
    local_15c8._0_3_ =
         CONCAT12((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  (undefined2)local_15c8);
    local_15c8._0_4_ =
         CONCAT13((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43),
                  (undefined3)local_15c8);
    local_15c8._0_5_ =
         CONCAT14((uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38),
                  (undefined4)local_15c8);
    local_15c8._0_6_ =
         CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41),
                  (undefined5)local_15c8);
    local_15c8._0_7_ =
         CONCAT16((uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44),
                  (undefined6)local_15c8);
    local_15c8 = CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)uVar47 - (0xff < uVar47),
                          (undefined7)local_15c8);
    uStack_15c0._0_1_ = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    uStack_15c0._1_1_ = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    uStack_15c0._2_1_ = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
    uStack_15c0._3_1_ = (uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46);
    uStack_15c0._4_1_ = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    uStack_15c0._5_1_ = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
    uStack_15c0._6_1_ = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
    uStack_15c0._7_1_ = (uVar48 != 0) * (uVar48 < 0x100) * (char)uVar48 - (0xff < uVar48);
    *in_RDX = local_15c8;
    in_RDX[1] = uStack_15c0;
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar22 + -1)) + iVar23 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar22 + 1)) + 2) >> 2);
    for (local_1510 = 1; local_1510 < 0x10; local_1510 = local_1510 + 1) {
      *(char *)((long)in_RDX + (long)(local_1510 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar22 + -1) - local_1510)) + iVar23 * 3 + 2) >>
                 2);
    }
    local_1504 = (byte)iVar23;
    local_d0._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1538 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar13 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_d0._0_3_)))));
    local_b0._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_15c8 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar14 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_b0._0_3_)))));
    local_90._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1558 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar15 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_90._0_3_)))));
    local_70._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1568 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar16 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,CONCAT13(local_1504,local_70._0_3_)))));
    src_temp17[0]._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1578 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar17 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,
                                                 CONCAT13(local_1504,(undefined3)src_temp17[0])))));
    src_temp15[0]._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1588 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar18 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,
                                                 CONCAT13(local_1504,(undefined3)src_temp15[0])))));
    src_temp13[1]._0_3_ = CONCAT21(CONCAT11(local_1504,local_1504),local_1504);
    local_1548 = (ulong)CONCAT11(local_1504,local_1504) << 8 | (ulong)local_1504 << 0x18 |
                 (ulong)local_1504 << 0x20 | (ulong)local_1504 << 0x28 | (ulong)local_1504 << 0x30 |
                 (ulong)local_1504 << 0x38;
    uVar19 = CONCAT17(local_1504,
                      CONCAT16(local_1504,
                               CONCAT15(local_1504,
                                        CONCAT14(local_1504,
                                                 CONCAT13(local_1504,(undefined3)src_temp13[1])))));
    for (local_1510 = 1; local_1510 < 0x10; local_1510 = local_1510 + 8) {
      local_1538 = local_1538 & 0xffffffffffffff00;
      bVar5 = *(byte *)((long)in_RDX + (long)(in_ECX * 2));
      bVar6 = *(byte *)((long)in_RDX + (long)(in_ECX * 3));
      bVar7 = *(byte *)((long)in_RDX + (long)(in_ECX << 2));
      bVar8 = *(byte *)((long)in_RDX + (long)(in_ECX * 5));
      bVar9 = *(byte *)((long)in_RDX + (long)(in_ECX * 6));
      bVar10 = *(byte *)((long)in_RDX + (long)(in_ECX * 7));
      *(ulong *)((long)in_RDX + (long)in_ECX) = local_1538 | *(byte *)((long)in_RDX + (long)in_ECX);
      ((ulong *)((long)in_RDX + (long)in_ECX))[1] = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 2));
      *puVar25 = local_15c8 & 0xffffffffffffff00 | (ulong)bVar5;
      puVar25[1] = uVar14;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 3));
      *puVar25 = local_1558 & 0xffffffffffffff00 | (ulong)bVar6;
      puVar25[1] = uVar15;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX << 2));
      *puVar25 = local_1568 & 0xffffffffffffff00 | (ulong)bVar7;
      puVar25[1] = uVar16;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 5));
      *puVar25 = local_1578 & 0xffffffffffffff00 | (ulong)bVar8;
      puVar25[1] = uVar17;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 6));
      *puVar25 = local_1588 & 0xffffffffffffff00 | (ulong)bVar9;
      puVar25[1] = uVar18;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 7));
      *puVar25 = local_1548 & 0xffffffffffffff00 | (ulong)bVar10;
      puVar25[1] = uVar19;
      local_15c8 = local_15c8 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 9));
      local_1558 = local_1558 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 10));
      local_1568 = local_1568 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 0xb));
      local_1578 = local_1578 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 0xc));
      local_1588 = local_1588 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 0xd));
      local_1548 = local_1548 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 0xe));
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX << 3));
      *puVar25 = local_1538 | *(byte *)((long)in_RDX + (long)(in_ECX << 3));
      puVar25[1] = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 9));
      *puVar25 = local_15c8;
      puVar25[1] = uVar14;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 10));
      *puVar25 = local_1558;
      puVar25[1] = uVar15;
      local_1538 = local_1538 | *(byte *)((long)in_RDX + (long)(in_ECX * 0xf));
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 0xb));
      *puVar25 = local_1568;
      puVar25[1] = uVar16;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 0xc));
      *puVar25 = local_1578;
      puVar25[1] = uVar17;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 0xd));
      *puVar25 = local_1588;
      puVar25[1] = uVar18;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 0xe));
      *puVar25 = local_1548;
      puVar25[1] = uVar19;
      puVar25 = (ulong *)((long)in_RDX + (long)(in_ECX * 0xf));
      *puVar25 = local_1538;
      puVar25[1] = uVar13;
    }
  }
  else if (in_R8D == 0x20) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + 1 + (long)iVar22);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 9 + (long)iVar22);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x11 + (long)iVar22);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x19 + (long)iVar22);
    auVar27 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x20),ZEXT816(0));
    auVar28 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x30),ZEXT816(0));
    auVar29 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x40),ZEXT816(0));
    auVar30 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x50),ZEXT816(0));
    pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
    auVar31 = pmovzxbw(*pauVar2,*(undefined8 *)*pauVar2);
    auVar32 = pmovzxbw(*pauVar3,*(undefined8 *)*pauVar3);
    auVar33 = pmovzxbw(*pauVar4,*(undefined8 *)*pauVar4);
    local_ab8 = auVar27._0_2_;
    sStack_ab6 = auVar27._2_2_;
    sStack_ab4 = auVar27._4_2_;
    sStack_ab2 = auVar27._6_2_;
    sStack_ab0 = auVar27._8_2_;
    sStack_aae = auVar27._10_2_;
    sStack_aac = auVar27._12_2_;
    sStack_aaa = auVar27._14_2_;
    local_ac8 = auVar28._0_2_;
    sStack_ac6 = auVar28._2_2_;
    sStack_ac4 = auVar28._4_2_;
    sStack_ac2 = auVar28._6_2_;
    sStack_ac0 = auVar28._8_2_;
    sStack_abe = auVar28._10_2_;
    sStack_abc = auVar28._12_2_;
    sStack_aba = auVar28._14_2_;
    local_ad8 = auVar29._0_2_;
    sStack_ad6 = auVar29._2_2_;
    sStack_ad4 = auVar29._4_2_;
    sStack_ad2 = auVar29._6_2_;
    sStack_ad0 = auVar29._8_2_;
    sStack_ace = auVar29._10_2_;
    sStack_acc = auVar29._12_2_;
    sStack_aca = auVar29._14_2_;
    local_ae8 = auVar30._0_2_;
    sStack_ae6 = auVar30._2_2_;
    sStack_ae4 = auVar30._4_2_;
    sStack_ae2 = auVar30._6_2_;
    sStack_ae0 = auVar30._8_2_;
    sStack_ade = auVar30._10_2_;
    sStack_adc = auVar30._12_2_;
    sStack_ada = auVar30._14_2_;
    local_1568._0_4_ =
         CONCAT22(sStack_ab6 + sStack_ac6 + sStack_ad6 + sStack_ae6,
                  local_ab8 + local_ac8 + local_ad8 + local_ae8);
    local_1568._0_6_ =
         CONCAT24(sStack_ab4 + sStack_ac4 + sStack_ad4 + sStack_ae4,(undefined4)local_1568);
    local_1568 = CONCAT26(sStack_ab2 + sStack_ac2 + sStack_ad2 + sStack_ae2,(undefined6)local_1568);
    uStack_1560._0_2_ = sStack_ab0 + sStack_ac0 + sStack_ad0 + sStack_ae0;
    uStack_1560._2_2_ = sStack_aae + sStack_abe + sStack_ace + sStack_ade;
    uStack_1560._4_2_ = sStack_aac + sStack_abc + sStack_acc + sStack_adc;
    uStack_1560._6_2_ = sStack_aaa + sStack_aba + sStack_aca + sStack_ada;
    auVar28._8_8_ = uStack_1560;
    auVar28._0_8_ = local_1568;
    auVar27[8] = '\x0f';
    auVar27[9] = '\x0f';
    auVar27[10] = '\x0f';
    auVar27[0xb] = '\x0f';
    auVar27[0xc] = '\x0f';
    auVar27[0xd] = '\x0f';
    auVar27[0xe] = '\x0f';
    auVar27[0xf] = '\x0f';
    auVar27[0] = '\0';
    auVar27[1] = '\x01';
    auVar27[2] = '\b';
    auVar27[3] = '\t';
    auVar27[4] = '\x0f';
    auVar27[5] = '\x0f';
    auVar27[6] = '\x0f';
    auVar27[7] = '\x0f';
    auVar27 = pshufb(auVar28,auVar27);
    auVar27 = phaddw(auVar27,ZEXT816(0));
    local_5d8 = auVar27._0_4_;
    iVar23 = (int)(((local_5d8 + (uint)*(byte *)(in_RDI + iVar23)) -
                   (uint)*(byte *)(in_RDI + iVar22)) + 0x20) >> local_1514 + 1;
    uVar26 = (short)(iVar23 * 3) + 2;
    uVar13 = CONCAT26(uVar26,CONCAT24(uVar26,CONCAT22(uVar26,uVar26)));
    uStack_b32 = auVar31._6_2_;
    uStack_b30 = auVar31._8_2_;
    uStack_b2e = auVar31._10_2_;
    uStack_b2c = auVar31._12_2_;
    uStack_b2a = auVar31._14_2_;
    uStack_b52 = auVar32._6_2_;
    uStack_b50 = auVar32._8_2_;
    uStack_b4e = auVar32._10_2_;
    uStack_b4c = auVar32._12_2_;
    uStack_b4a = auVar32._14_2_;
    local_b78 = auVar33._0_2_;
    uStack_b76 = auVar33._2_2_;
    uStack_b74 = auVar33._4_2_;
    uStack_b72 = auVar33._6_2_;
    uStack_b70 = auVar33._8_2_;
    uStack_b6e = auVar33._10_2_;
    uStack_b6c = auVar33._12_2_;
    uStack_b6a = auVar33._14_2_;
    uVar34 = (ushort)(local_b78 + uVar26) >> 2;
    uVar35 = (ushort)(uStack_b76 + uVar26) >> 2;
    uVar36 = (ushort)(uStack_b74 + uVar26) >> 2;
    uVar37 = (ushort)(uStack_b72 + uVar26) >> 2;
    uVar40 = (ushort)(uStack_b70 + uVar26) >> 2;
    uVar43 = (ushort)(uStack_b6e + uVar26) >> 2;
    uVar46 = (ushort)(uStack_b6c + uVar26) >> 2;
    uVar38 = (ushort)(uStack_b6a + uVar26) >> 2;
    local_458 = auVar31._0_2_;
    uStack_456 = auVar31._2_2_;
    uStack_454 = auVar31._4_2_;
    local_458 = local_458 >> 2;
    uStack_456 = uStack_456 >> 2;
    uStack_454 = uStack_454 >> 2;
    uStack_b32 = uStack_b32 >> 2;
    uStack_b30 = uStack_b30 >> 2;
    uStack_b2e = uStack_b2e >> 2;
    uStack_b2c = uStack_b2c >> 2;
    uStack_b2a = uStack_b2a >> 2;
    local_478 = auVar32._0_2_;
    uStack_476 = auVar32._2_2_;
    uStack_474 = auVar32._4_2_;
    local_478 = local_478 >> 2;
    uStack_476 = uStack_476 >> 2;
    uStack_474 = uStack_474 >> 2;
    uStack_b52 = uStack_b52 >> 2;
    uStack_b50 = uStack_b50 >> 2;
    uStack_b4e = uStack_b4e >> 2;
    uStack_b4c = uStack_b4c >> 2;
    uStack_b4a = uStack_b4a >> 2;
    local_b78 = local_b78 >> 2;
    uStack_b76 = uStack_b76 >> 2;
    uStack_b74 = uStack_b74 >> 2;
    uStack_b72 = uStack_b72 >> 2;
    uStack_b70 = uStack_b70 >> 2;
    uStack_b6e = uStack_b6e >> 2;
    uStack_b6c = uStack_b6c >> 2;
    uStack_b6a = uStack_b6a >> 2;
    local_15c8._0_2_ =
         CONCAT11((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                  (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34));
    local_15c8._0_3_ =
         CONCAT12((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined2)local_15c8);
    local_15c8._0_4_ =
         CONCAT13((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  (undefined3)local_15c8);
    local_15c8._0_5_ =
         CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40),
                  (undefined4)local_15c8);
    local_15c8._0_6_ =
         CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43),
                  (undefined5)local_15c8);
    local_15c8._0_7_ =
         CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46),
                  (undefined6)local_15c8);
    local_15c8 = CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38),
                          (undefined7)local_15c8);
    uStack_15c0._0_1_ =
         (local_458 != 0) * (local_458 < 0x100) * (char)local_458 - (0xff < local_458);
    uStack_15c0._1_1_ =
         (uStack_456 != 0) * (uStack_456 < 0x100) * (char)uStack_456 - (0xff < uStack_456);
    uStack_15c0._2_1_ =
         (uStack_454 != 0) * (uStack_454 < 0x100) * (char)uStack_454 - (0xff < uStack_454);
    uStack_15c0._3_1_ =
         (uStack_b32 != 0) * (uStack_b32 < 0x100) * (char)uStack_b32 - (0xff < uStack_b32);
    uStack_15c0._4_1_ =
         (uStack_b30 != 0) * (uStack_b30 < 0x100) * (char)uStack_b30 - (0xff < uStack_b30);
    uStack_15c0._5_1_ =
         (uStack_b2e != 0) * (uStack_b2e < 0x100) * (char)uStack_b2e - (0xff < uStack_b2e);
    uStack_15c0._6_1_ =
         (uStack_b2c != 0) * (uStack_b2c < 0x100) * (char)uStack_b2c - (0xff < uStack_b2c);
    uStack_15c0._7_1_ =
         (uStack_b2a != 0) * (uStack_b2a < 0x100) * (char)uStack_b2a - (0xff < uStack_b2a);
    local_15b8._0_2_ =
         CONCAT11((uStack_476 != 0) * (uStack_476 < 0x100) * (char)uStack_476 - (0xff < uStack_476),
                  (local_478 != 0) * (local_478 < 0x100) * (char)local_478 - (0xff < local_478));
    local_15b8._0_3_ =
         CONCAT12((uStack_474 != 0) * (uStack_474 < 0x100) * (char)uStack_474 - (0xff < uStack_474),
                  (undefined2)local_15b8);
    local_15b8._0_4_ =
         CONCAT13((uStack_b52 != 0) * (uStack_b52 < 0x100) * (char)uStack_b52 - (0xff < uStack_b52),
                  (undefined3)local_15b8);
    local_15b8._0_5_ =
         CONCAT14((uStack_b50 != 0) * (uStack_b50 < 0x100) * (char)uStack_b50 - (0xff < uStack_b50),
                  (undefined4)local_15b8);
    local_15b8._0_6_ =
         CONCAT15((uStack_b4e != 0) * (uStack_b4e < 0x100) * (char)uStack_b4e - (0xff < uStack_b4e),
                  (undefined5)local_15b8);
    local_15b8._0_7_ =
         CONCAT16((uStack_b4c != 0) * (uStack_b4c < 0x100) * (char)uStack_b4c - (0xff < uStack_b4c),
                  (undefined6)local_15b8);
    local_15b8 = CONCAT17((uStack_b4a != 0) * (uStack_b4a < 0x100) * (char)uStack_b4a -
                          (0xff < uStack_b4a),(undefined7)local_15b8);
    uStack_15b0._0_1_ =
         (local_b78 != 0) * (local_b78 < 0x100) * (char)local_b78 - (0xff < local_b78);
    uStack_15b0._1_1_ =
         (uStack_b76 != 0) * (uStack_b76 < 0x100) * (char)uStack_b76 - (0xff < uStack_b76);
    uStack_15b0._2_1_ =
         (uStack_b74 != 0) * (uStack_b74 < 0x100) * (char)uStack_b74 - (0xff < uStack_b74);
    uStack_15b0._3_1_ =
         (uStack_b72 != 0) * (uStack_b72 < 0x100) * (char)uStack_b72 - (0xff < uStack_b72);
    uStack_15b0._4_1_ =
         (uStack_b70 != 0) * (uStack_b70 < 0x100) * (char)uStack_b70 - (0xff < uStack_b70);
    uStack_15b0._5_1_ =
         (uStack_b6e != 0) * (uStack_b6e < 0x100) * (char)uStack_b6e - (0xff < uStack_b6e);
    uStack_15b0._6_1_ =
         (uStack_b6c != 0) * (uStack_b6c < 0x100) * (char)uStack_b6c - (0xff < uStack_b6c);
    uStack_15b0._7_1_ =
         (uStack_b6a != 0) * (uStack_b6a < 0x100) * (char)uStack_b6a - (0xff < uStack_b6a);
    *in_RDX = local_15c8;
    in_RDX[1] = uStack_15c0;
    in_RDX[2] = local_15b8;
    in_RDX[3] = uStack_15b0;
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar22 + -1)) + iVar23 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar22 + 1)) + 2) >> 2);
    for (local_1510 = 1; local_1510 < 0x20; local_1510 = local_1510 + 1) {
      *(char *)((long)in_RDX + (long)(local_1510 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar22 + -1) - local_1510)) + iVar23 * 3 + 2) >>
                 2);
    }
    uVar14 = (ulong)CONCAT24(uVar26,CONCAT22(uVar26,uVar26)) & 0xffffffffffffff00 |
             (ulong)uVar26 << 0x30 | (ulong)(byte)iVar23;
    local_1578 = uVar14;
    local_1538 = uVar14;
    local_15c8 = uVar14;
    local_1558 = uVar14;
    local_1568 = uVar14;
    local_1588 = uVar14;
    local_1548 = uVar14;
    for (local_1510 = 1; local_1510 < 0x20; local_1510 = local_1510 + 1) {
      local_1538 = local_1538 & 0xffffffffffffff00 | (ulong)*(byte *)((long)in_RDX + (long)in_ECX);
      local_15c8 = local_15c8 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 2));
      local_1558 = local_1558 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 3));
      local_1568 = local_1568 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX << 2));
      local_1578 = local_1578 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 5));
      local_1588 = local_1588 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 6));
      local_1548 = local_1548 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(in_ECX * 7));
      puVar25 = (ulong *)((long)in_RDX + (long)(local_1510 * in_ECX));
      *puVar25 = local_1538;
      puVar25[1] = uVar13;
      *(ulong *)((long)in_RDX + (long)(local_1510 * in_ECX) + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)(local_1510 * in_ECX) + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 1) * in_ECX));
      *puVar25 = local_15c8;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 1) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 2) * in_ECX));
      *puVar25 = local_1558;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 2) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 3) * in_ECX));
      *puVar25 = local_1568;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 3) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 4) * in_ECX));
      *puVar25 = local_1578;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 5) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 5) * in_ECX));
      *puVar25 = local_1588;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 5) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
      puVar25 = (ulong *)((long)in_RDX + (long)((local_1510 + 6) * in_ECX));
      *puVar25 = local_1548;
      puVar25[1] = uVar13;
      iVar22 = (local_1510 + 6) * in_ECX;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x10) = uVar14;
      *(ulong *)((long)in_RDX + (long)iVar22 + 0x18) = uVar13;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc_sse42(UWORD8 *pu1_ref,
                                    WORD32 src_strd,
                                    UWORD8 *pu1_dst,
                                    WORD32 dst_strd,
                                    WORD32 nt,
                                    WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 row;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    __m128i src_temp1, src_temp7, src_temp3, src_temp4, src_temp5, src_temp6;
    __m128i src_temp8, src_temp9, src_temp10, src_temp2;
    __m128i m_zero = _mm_set1_epi32(0);
    __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK5[0]);
    UNUSED(src_strd);
    UNUSED(mode);


    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */



    if(nt == 32)
    {
        __m128i temp;
        WORD32 itr_count;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

        src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
        src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
        src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
        src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

        src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

        src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        acc_dc = _mm_cvtsi128_si32(src_temp4);

        acc_dc += pu1_ref[three_nt];
        acc_dc -= pu1_ref[two_nt];

        /* computing acc_dc value */
        dc_val = (acc_dc + nt) >> (log2nt + 1);

        two_dc_val = 2 * dc_val;
        three_dc_val = 3 * dc_val;

        temp = _mm_set1_epi8(dc_val);

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp);

            pu1_dst += 16 * dst_strd;
        }
    }

    else

    {
        __m128i  zero_8x16b;
        __m128i sm1 = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        if(nt == 4) /* nt multiple of 4*/
        {
            WORD32 temp1, temp2, temp3;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp2 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            src_temp4 =  _mm_cvtepu8_epi16(src_temp3);
            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);

            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);
            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

/* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, zero_8x16b);

            temp1 = _mm_cvtsi128_si32(src_temp2);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

            src_temp2 = _mm_insert_epi8(src_temp2, dc_val, 0);

            src_temp2 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp3 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp4 =  _mm_shuffle_epi8(src_temp2, sm1);

            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[(1 * dst_strd) + 0], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[(2 * dst_strd) + 0], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[(3 * dst_strd) + 0], 0);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));

            src_temp4 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp2 = _mm_packus_epi16(src_temp2, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp2);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

            /* Fill the remaining rows with DC value*/

            src_temp1 = _mm_set1_epi8(dc_val);
            src_temp2 = _mm_set1_epi8(dc_val);
            src_temp3 = _mm_set1_epi8(dc_val);
            src_temp4 = _mm_set1_epi8(dc_val);
            src_temp5 = _mm_set1_epi8(dc_val);
            src_temp6 = _mm_set1_epi8(dc_val);
            src_temp7 = _mm_set1_epi8(dc_val);

            src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
            src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
            src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

        }
        else if(nt == 16) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));

            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);

            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
            src_temp10 =  _mm_cvtepu8_epi16(src_temp10);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp10 = _mm_add_epi16(src_temp10, src_temp1);
            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;
            /* Fill the remaining rows with DC value*/
            src_temp1 =  _mm_set1_epi8(dc_val);
            src_temp2 =  _mm_set1_epi8(dc_val);
            src_temp3 =  _mm_set1_epi8(dc_val);
            src_temp4 =  _mm_set1_epi8(dc_val);
            src_temp5 =  _mm_set1_epi8(dc_val);
            src_temp6 =  _mm_set1_epi8(dc_val);
            src_temp7 =  _mm_set1_epi8(dc_val);

            for(row = 1; row < nt; row += 8)
            {

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((8) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((9) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((10) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((11) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((12) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((13) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((14) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp3);

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((15) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp1);

            }

        }
        else if(nt == 32) /* if nt%8==0*/
        {

            __m128i src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16, src_temp17;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
            src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
            src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp9 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 24));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
            src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
            src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
            src_temp6 =  _mm_cvtepu8_epi16(src_temp6);
            src_temp9 =  _mm_cvtepu8_epi16(src_temp9);
            src_temp10 =  _mm_cvtepu8_epi16(src_temp10);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
            src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp6, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp9, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp10, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp6 = _mm_srli_epi16(src_temp6, 2);
            src_temp9 = _mm_srli_epi16(src_temp9, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp6);
            src_temp10 = _mm_packus_epi16(src_temp9, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp10);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;
            /* Fill the remaining rows with DC value*/
            src_temp1 = _mm_insert_epi8(src_temp1, dc_val, 0);

            src_temp2 =  src_temp1;
            src_temp3 = src_temp1;
            src_temp4 =  src_temp1;
            src_temp5 =  src_temp1;
            src_temp6 =  src_temp1;
            src_temp7 =  src_temp1;

            src_temp12 = src_temp1;
            src_temp13 = src_temp1;
            src_temp14 = src_temp1;
            src_temp15 = src_temp1;
            src_temp16 = src_temp1;
            src_temp17 = src_temp1;
            src_temp11 = src_temp1;

            for(row = 1; row < nt; row++)
            {
                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 16), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 16), src_temp13);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 16), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd) + 16), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd) + 16), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd) + 16), src_temp17);


            }

        }
    }
}